

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# buffer.cc
# Opt level: O0

bool __thiscall rcg::Buffer::getContainsChunkdata(Buffer *this)

{
  undefined8 *in_RDI;
  shared_ptr<const_rcg::GenTLWrapper> *unaff_retaddr;
  undefined8 *buffer;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  bool bVar1;
  
  if (in_RDI[4] == 4) {
    bVar1 = true;
  }
  else {
    buffer = in_RDI;
    Stream::getHandle((Stream *)*in_RDI);
    bVar1 = anon_unknown_5::getBufferBool
                      (unaff_retaddr,
                       (void *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),buffer,
                       (BUFFER_INFO_CMD)((ulong)in_RDI >> 0x20));
  }
  return bVar1;
}

Assistant:

bool Buffer::getContainsChunkdata() const
{
  if (payload_type == PAYLOAD_TYPE_CHUNK_DATA)
  {
    return true;
  }

  return getBufferBool(gentl, parent->getHandle(), buffer,
                       GenTL::BUFFER_INFO_CONTAINS_CHUNKDATA);
}